

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O0

void Iota(Sarray *A,int index)

{
  ulong uVar1;
  ulong uVar2;
  initializer_list<unsigned_long> __l;
  reference pvVar3;
  reference pvVar4;
  allocator<unsigned_long> local_101;
  unsigned_long local_100 [24];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v;
  int index_local;
  Sarray *A_local;
  
  v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = index;
  memcpy(local_100,&DAT_00109008,0xc0);
  local_38 = 0x18;
  local_40 = local_100;
  std::allocator<unsigned_long>::allocator(&local_101);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,__l,&local_101);
  std::allocator<unsigned_long>::~allocator(&local_101);
  pvVar3 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,0);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar3,0);
  uVar1 = *pvVar4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30,
                      (long)v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  uVar2 = *pvVar4;
  pvVar3 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,0);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar3,0);
  *pvVar4 = uVar1 ^ uVar2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_30);
  return;
}

Assistant:

void Iota(Sarray &A,int index){
    vector<uint64_t> v = {
        0b0000000000000000000000000000000000000000000000000000000000000001,
        0b0000000000000000000000000000000000000000000000001000000010000010,
        0b1000000000000000000000000000000000000000000000001000000010001010,
        0b1000000000000000000000000000000010000000000000001000000000000000,
        0b0000000000000000000000000000000000000000000000001000000010001011,
        0b0000000000000000000000000000000010000000000000000000000000000001,
        0b1000000000000000000000000000000010000000000000001000000010000001,
        0b1000000000000000000000000000000000000000000000001000000000001001,
        0b0000000000000000000000000000000000000000000000000000000010001010,
        0b0000000000000000000000000000000000000000000000000000000010001000,
        0b0000000000000000000000000000000010000000000000001000000000001001,
        0b0000000000000000000000000000000010000000000000000000000000001010,
        0b0000000000000000000000000000000010000000000000001000000010001011,
        0b1000000000000000000000000000000000000000000000000000000010001011,
        0b1000000000000000000000000000000000000000000000001000000010001001,
        0b1000000000000000000000000000000000000000000000001000000000000011,
        0b1000000000000000000000000000000000000000000000001000000000000010,
        0b1000000000000000000000000000000000000000000000000000000010000000,
        0b0000000000000000000000000000000000000000000000001000000000001010,
        0b1000000000000000000000000000000010000000000000000000000000001010,
        0b1000000000000000000000000000000010000000000000001000000010000001,
        0b1000000000000000000000000000000000000000000000001000000010000000,
        0b0000000000000000000000000000000010000000000000000000000000000001,
        0b1000000000000000000000000000000010000000000000001000000000001000,
    };
    A[0][0] = A[0][0]^(v[index]);
}